

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void save_pos_for_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object obj;
  Am_Object scroll_command;
  Am_Object scrollbar;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value value;
  Am_Object inter;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)command_obj);
  Am_Object::Get_Owner(&scrollbar,(Am_Slot_Flags)&inter);
  Am_Object::Get_Object(&scroll_command,(Am_Slot_Key)&scrollbar,0xc5);
  Am_Object::Am_Object(&local_38,command_obj);
  Am_Object::Am_Object(&local_40,&scroll_command);
  Am_Object::Am_Object(&local_48,&scrollbar);
  set_up_for_undo(&local_38,&local_40,&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::operator=(&obj,&scroll_command);
  while( true ) {
    in_value = Am_Object::Get(&obj,0x154,1);
    Am_Value::operator=(&value,in_value);
    bVar1 = Am_Value::Valid(&value);
    if (!bVar1) break;
    if (value.type != 0xa001) goto LAB_0024bf62;
    Am_Object::operator=(&obj,&value);
  }
  Am_Object::Set(&obj,0x154,-2,0);
LAB_0024bf62:
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&obj);
  Am_Object::~Am_Object(&scroll_command);
  Am_Object::~Am_Object(&scrollbar);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, save_pos_for_undo,
                 (Am_Object command_obj))
{
  Am_Object inter = command_obj.Get_Owner();
  Am_Object scrollbar = inter.Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  set_up_for_undo(command_obj, scroll_command, scrollbar);
  //find the top-level parent and mark it as not queued until the
  //final do action
  Am_Object obj;
  Am_Value value;
  obj = scroll_command;
  while (true) {
    value = obj.Peek(Am_IMPLEMENTATION_PARENT);
    if (value.Valid()) {
      if (value.type != Am_OBJECT)
        break; //already marked as not queued
    } else {   // not valid
      obj.Set(Am_IMPLEMENTATION_PARENT, Am_MARKER_FOR_SCROLL_INC);
      break;
    }
    obj = value;
  }
}